

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.h
# Opt level: O1

void __thiscall
wallet::WalletDescriptor::WalletDescriptor
          (WalletDescriptor *this,shared_ptr<Descriptor> descriptor,uint64_t creation_time,
          int32_t range_start,int32_t range_end,int32_t next_index)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  long in_FS_OFFSET;
  
  peVar3 = descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar3->_vptr_Descriptor;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3[1]._vptr_Descriptor;
  (this->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  DescriptorID(&this->id,(Descriptor *)peVar3->_vptr_Descriptor);
  this->creation_time =
       (uint64_t)
       descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._M_pi
  ;
  this->range_start = (int32_t)creation_time;
  this->range_end = range_start;
  this->next_index = range_end;
  (this->cache).m_derived_xpubs._M_h._M_buckets =
       &(this->cache).m_derived_xpubs._M_h._M_single_bucket;
  (this->cache).m_derived_xpubs._M_h._M_bucket_count = 1;
  (this->cache).m_derived_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cache).m_derived_xpubs._M_h._M_element_count = 0;
  (this->cache).m_derived_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cache).m_derived_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cache).m_derived_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->cache).m_parent_xpubs._M_h._M_buckets = &(this->cache).m_parent_xpubs._M_h._M_single_bucket
  ;
  (this->cache).m_parent_xpubs._M_h._M_bucket_count = 1;
  (this->cache).m_parent_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cache).m_parent_xpubs._M_h._M_element_count = 0;
  (this->cache).m_parent_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cache).m_parent_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cache).m_parent_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->cache).m_last_hardened_xpubs._M_h._M_buckets =
       &(this->cache).m_last_hardened_xpubs._M_h._M_single_bucket;
  (this->cache).m_last_hardened_xpubs._M_h._M_bucket_count = 1;
  (this->cache).m_last_hardened_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cache).m_last_hardened_xpubs._M_h._M_element_count = 0;
  (this->cache).m_last_hardened_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (this->cache).m_last_hardened_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
    (this->cache).m_last_hardened_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

WalletDescriptor(std::shared_ptr<Descriptor> descriptor, uint64_t creation_time, int32_t range_start, int32_t range_end, int32_t next_index) : descriptor(descriptor), id(DescriptorID(*descriptor)), creation_time(creation_time), range_start(range_start), range_end(range_end), next_index(next_index) { }